

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::TypenameFunction::~TypenameFunction(TypenameFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~TypenameFunction((TypenameFunction *)0x13823f8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TypenameFunction() : SystemSubroutine(KnownSystemName::Typename, SubroutineKind::Function) {}